

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  long lVar1;
  char cVar2;
  long lVar3;
  PointCloudDecoder *pPVar4;
  PredictionSchemeTypedDecoderInterface<int,_int> *pPVar5;
  _Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false> _Var6;
  int iVar7;
  PredictionSchemeTypedDecoderInterface<int,_int> *in_RAX;
  _Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false> local_28;
  
  lVar3 = in_buffer->pos_;
  lVar1 = lVar3 + 1;
  if (lVar1 <= in_buffer->data_size_) {
    cVar2 = in_buffer->data_[lVar3];
    in_buffer->pos_ = lVar1;
    local_28._M_head_impl = in_RAX;
    if (cVar2 != -2) {
      if (in_buffer->data_size_ < lVar3 + 2) {
        return false;
      }
      cVar2 = in_buffer->data_[lVar1];
      in_buffer->pos_ = lVar3 + 2;
      if ((byte)(cVar2 - 4U) < 0xfb) {
        return false;
      }
      (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[10])
                (&local_28,this);
      _Var6._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0;
      pPVar5 = (this->prediction_scheme_)._M_t.
               super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               .
               super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
               ._M_head_impl;
      (this->prediction_scheme_)._M_t.
      super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
      .super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>.
      _M_head_impl = _Var6._M_head_impl;
      if ((pPVar5 != (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) &&
         ((**(code **)((long)(pPVar5->super_PredictionSchemeDecoderInterface).
                             super_PredictionSchemeInterface + 8))(),
         local_28._M_head_impl != (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0)) {
        (*((local_28._M_head_impl)->super_PredictionSchemeDecoderInterface).
          super_PredictionSchemeInterface._vptr_PredictionSchemeInterface[1])();
      }
    }
    if (((((this->prediction_scheme_)._M_t.
           super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           .super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>.
           _M_head_impl == (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) ||
         (iVar7 = (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[7])
                            (this), (char)iVar7 != '\0')) &&
        (iVar7 = (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[9])
                           (this,point_ids,in_buffer), (char)iVar7 != '\0')) &&
       (((pPVar4 = (this->super_SequentialAttributeDecoder).decoder_,
         pPVar4 == (PointCloudDecoder *)0x0 || (1 < pPVar4->version_major_)) ||
        (iVar7 = (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[0xc])
                           (this,(ulong)((long)(point_ids->
                                               super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(point_ids->
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 2),
        (char)iVar7 != '\0')))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  // Decode prediction scheme.
  int8_t prediction_scheme_method;
  if (!in_buffer->Decode(&prediction_scheme_method)) {
    return false;
  }
  if (prediction_scheme_method != PREDICTION_NONE) {
    int8_t prediction_transform_type;
    if (!in_buffer->Decode(&prediction_transform_type)) {
      return false;
    }
    // Check that decoded prediction scheme transform type is valid.
    if (prediction_transform_type < PREDICTION_TRANSFORM_NONE ||
        prediction_transform_type >= NUM_PREDICTION_SCHEME_TRANSFORM_TYPES) {
      return false;
    }
    prediction_scheme_ = CreateIntPredictionScheme(
        static_cast<PredictionSchemeMethod>(prediction_scheme_method),
        static_cast<PredictionSchemeTransformType>(prediction_transform_type));
  }

  if (prediction_scheme_) {
    if (!InitPredictionScheme(prediction_scheme_.get())) {
      return false;
    }
  }

  if (!DecodeIntegerValues(point_ids, in_buffer)) {
    return false;
  }

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  const int32_t num_values = static_cast<uint32_t>(point_ids.size());
  if (decoder() &&
      decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    // For older files, revert the transform right after we decode the data.
    if (!StoreValues(num_values)) {
      return false;
    }
  }
#endif
  return true;
}